

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_FastGen.hpp
# Opt level: O3

bool __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::matchNextAux
          (GenMatcher *this,TermList queryTerm,TermList nodeTerm,bool separate)

{
  ArrayMapEntry<Kernel::TermList> *pAVar1;
  int iVar2;
  uint *puVar3;
  uint uVar4;
  int iVar5;
  TermList TVar6;
  char cVar7;
  Binder binder;
  GenMatcher *local_20;
  socklen_t local_18;
  
  local_20 = this;
  if ((nodeTerm._content & 3) == 0) {
    if ((*(byte *)(nodeTerm._content + 0x28) & 8) != 0) {
      TVar6._content = nodeTerm._content;
      if (*(int *)(nodeTerm._content + 0xc) < 0) {
        iVar2 = 0;
        do {
          TVar6._content = *(ulong *)(TVar6._content + 0x20);
          if ((TVar6._content & 1) != 0) {
            iVar5 = 3;
            goto LAB_002f9075;
          }
          iVar2 = iVar2 + 2;
        } while (*(int *)(TVar6._content + 0xc) < 0);
      }
      else {
        iVar2 = 0;
      }
      iVar5 = *(int *)(TVar6._content + 0x20);
LAB_002f9075:
      if (iVar2 + iVar5 == 0) {
        cVar7 = nodeTerm._content == queryTerm._content;
        goto LAB_002f90b0;
      }
    }
    local_18 = this->_maxVar;
    if (((queryTerm._content & 3) == 0) &&
       (*(int *)(queryTerm._content + 8) == *(int *)(nodeTerm._content + 8))) {
      cVar7 = Kernel::MatchingUtils::
              matchArgs<Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Lhs>::GenMatcher::Binder>
                        ((MatchingUtils *)nodeTerm._content,(Term *)queryTerm._content,
                         (Term *)&stack0xffffffffffffffe0,(Binder *)&stack0xffffffffffffffe0);
    }
    else {
      cVar7 = '\0';
    }
  }
  else {
    local_18 = this->_maxVar;
    iVar2 = Binder::bind((Binder *)&stack0xffffffffffffffe0,(int)(nodeTerm._content >> 2),
                         (sockaddr *)queryTerm._content,local_18);
    cVar7 = (char)iVar2;
  }
LAB_002f90b0:
  if (separate && cVar7 == '\0') {
    puVar3 = (this->_boundVars)._cursor;
    uVar4 = puVar3[-1];
    puVar3 = puVar3 + -1;
    if (uVar4 != 0xffffffff) {
      pAVar1 = (this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array;
      do {
        pAVar1[uVar4]._timestamp = 0;
        uVar4 = puVar3[-1];
        puVar3 = puVar3 + -1;
      } while (uVar4 != 0xffffffff);
    }
    (this->_boundVars)._cursor = puVar3;
  }
  return (bool)cVar7;
}

Assistant:

bool SubstitutionTree<LeafData_>::GenMatcher::matchNextAux(TermList queryTerm, TermList nodeTerm, bool separate)
{
  bool success;
  if(nodeTerm.isTerm()) {
    Term* nt=nodeTerm.term();
    if(nt->shared() && nt->ground()) {
      //ground terms match only iff they're equal
      success = nodeTerm==queryTerm;
    } else {
      Binder binder(this);
      ASS(nt->arity()>0);

      success = queryTerm.isTerm() && queryTerm.term()->functor()==nt->functor() &&
	MatchingUtils::matchArgs(nt, queryTerm.term(), binder);
    }
  } else {
    ASS_METHOD(nodeTerm,isOrdinaryVar());
    unsigned var=nodeTerm.var();
    Binder binder(this);
    success=binder.bind(var,queryTerm);
  }

  if(!success) {
    //if this matching was joined to the previous one, we don't
    //have to care about unbinding as caller will do this by calling
    //backtrack for the matching we're joined to.
    if(separate) {
      //we have to unbind ordinary variables, that were bound.
      for(;;) {
	unsigned boundVar = _boundVars.pop();
	if(boundVar==BACKTRACK_SEPARATOR) {
	  break;
	}
	_bindings.remove(boundVar);
      }
    }
  }

  return success;
}